

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O2

torrent_handle __thiscall
libtorrent::peer_connection_handle::associated_torrent(peer_connection_handle *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  torrent_handle tVar1;
  shared_ptr<libtorrent::aux::torrent> t;
  shared_ptr<libtorrent::aux::peer_connection> pc;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> local_38;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38);
  if (local_38._M_ptr == (element_type *)0x0) {
    (this->m_connection).
    super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_connection).
    super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_28,
               &((local_38._M_ptr)->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,&local_28);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28._M_refcount);
    if (local_48._M_ptr == (element_type *)0x0) {
      (this->m_connection).
      super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->m_connection).
      super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      aux::torrent::get_handle((torrent *)this);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (torrent_handle)
         tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle peer_connection_handle::associated_torrent() const
{
	std::shared_ptr<aux::peer_connection> pc = native_handle();
	if (!pc) return torrent_handle();
	auto t = pc->associated_torrent().lock();
	if (!t) return torrent_handle();
	return t->get_handle();
}